

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakeDepend.cxx
# Opt level: O3

void __thiscall cmMakeDepend::~cmMakeDepend(cmMakeDepend *this)

{
  ~cmMakeDepend(this);
  operator_delete(this,0x230);
  return;
}

Assistant:

cmMakeDepend::~cmMakeDepend()
{
  cmDeleteAll(this->DependInformationMap);
}